

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-vec1.c
# Opt level: O2

void mul_mat_vec_f16_0(uint16_t *src0,uint16_t *src1,float *dst,int nrows,int ncols)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  int j;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int j_1;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 extraout_var [60];
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)nrows;
  if (nrows < 1) {
    uVar4 = uVar5;
  }
  for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    auVar7 = ZEXT816(0) << 0x40;
    for (lVar3 = 0; lVar3 < (int)(ncols & 0xfffffff8); lVar3 = lVar3 + 8) {
      auVar1 = vcvtph2ps_f16c(*(undefined1 (*) [16])(src0 + lVar3));
      auVar2 = vcvtph2ps_f16c(*(undefined1 (*) [16])(src1 + lVar3));
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar1,auVar2);
    }
    auVar8._0_4_ = auVar7._0_4_ + 0.0;
    auVar8._4_4_ = auVar7._4_4_ + 0.0;
    auVar8._8_4_ = auVar7._8_4_ + 0.0;
    auVar8._12_4_ = auVar7._12_4_ + 0.0;
    auVar7 = vshufpd_avx(auVar8,auVar8,1);
    auVar9._0_4_ = auVar8._0_4_ + auVar7._0_4_;
    auVar9._4_4_ = auVar8._4_4_ + auVar7._4_4_;
    auVar9._8_4_ = auVar8._8_4_ + auVar7._8_4_;
    auVar9._12_4_ = auVar8._12_4_ + auVar7._12_4_;
    auVar7 = vhaddps_avx(auVar9,auVar9);
    dst[uVar5] = auVar7._0_4_;
    for (lVar3 = (long)(int)(ncols & 0xfffffff8); lVar3 < ncols; lVar3 = lVar3 + 1) {
      fVar6 = fp16_ieee_to_fp32_value(src0[lVar3]);
      auVar10._0_4_ = fp16_ieee_to_fp32_value(src1[lVar3]);
      auVar10._4_60_ = extraout_var;
      auVar7 = vfmadd231ss_fma(auVar7,auVar10._0_16_,ZEXT416((uint)fVar6));
      dst[uVar5] = auVar7._0_4_;
    }
    src0 = src0 + ncols;
  }
  return;
}

Assistant:

void mul_mat_vec_f16_0(
    const uint16_t * src0,
    const uint16_t * src1,
             float * dst,
    int nrows,
    int ncols) {

    const int ncols8 = ncols & ~7;

    for (int i = 0; i < nrows; i++) {
        __m256 sum = _mm256_setzero_ps();

        const uint16_t * src0_row = src0 + i * ncols;
        for (int j = 0; j < ncols8; j += 8) {
            __m256 a = _mm256_cvtph_ps(_mm_loadu_si128((__m128i*)(src0_row + j)));
            __m256 b = _mm256_cvtph_ps(_mm_loadu_si128((__m128i*)(src1 + j)));
#if defined(__FMA__)
            sum = _mm256_fmadd_ps(a, b, sum);
#else
            sum = _mm256_add_ps(_mm256_mul_ps(a, b), sum);
#endif
        }
        dst[i] = reduce_vector8_0(sum);

        for (int j = ncols8; j < ncols; j++) {
            dst[i] += fp16_ieee_to_fp32_value(src0_row[j]) * fp16_ieee_to_fp32_value(src1[j]);
        }
    }
}